

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string_view pbrt::dequoteString(Token *t)

{
  pbrt *this;
  char *pcVar1;
  char *in_RCX;
  string_view sVar2;
  string_view s;
  string local_30;
  
  this = (pbrt *)(t->token)._M_len;
  pcVar1 = (t->token)._M_str;
  if ((((pbrt *)0x1 < this) && (*pcVar1 == '\"')) && ((pcVar1 + -1)[(long)this] == '\"')) {
    sVar2._M_str = pcVar1 + 1;
    sVar2._M_len = this + -2;
    return sVar2;
  }
  s._M_str = in_RCX;
  s._M_len = (size_t)pcVar1;
  toString_abi_cxx11_(&local_30,this,s);
  ErrorExit<std::__cxx11::string>(&t->loc,"\"%s\": expected quoted string",&local_30);
}

Assistant:

static std::string_view dequoteString(const Token &t) {
    if (!isQuotedString(t.token))
        ErrorExit(&t.loc, "\"%s\": expected quoted string", toString(t.token));

    std::string_view str = t.token;
    str.remove_prefix(1);
    str.remove_suffix(1);
    return str;
}